

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

CordRepBtree * absl::cord_internal::CordRepBtree::Rebuild(CordRepBtree *tree)

{
  long *plVar1;
  CordRepBtree *pCVar2;
  CordRepBtree *pCVar3;
  CordRepBtree *pCVar4;
  long lVar5;
  CordRepBtree *pCVar6;
  CordRepBtree *(*__range2) [13];
  bool bVar7;
  CordRepBtree *stack [13];
  CordRepBtree *local_88;
  long alStack_80 [12];
  
  pCVar3 = (CordRepBtree *)operator_new(0x40);
  (pCVar3->super_CordRep).refcount = (atomic<int>)0x2;
  (pCVar3->super_CordRep).tag = '\x03';
  (pCVar3->super_CordRep).storage[0] = '\0';
  (pCVar3->super_CordRep).storage[1] = '\0';
  (pCVar3->super_CordRep).storage[2] = '\0';
  bVar7 = false;
  (pCVar3->super_CordRep).length = 0;
  alStack_80[0] = 0;
  alStack_80[0xb] = 0;
  alStack_80[9] = 0;
  alStack_80[10] = 0;
  alStack_80[7] = 0;
  alStack_80[8] = 0;
  alStack_80[5] = 0;
  alStack_80[6] = 0;
  alStack_80[3] = 0;
  alStack_80[4] = 0;
  alStack_80[1] = 0;
  alStack_80[2] = 0;
  local_88 = pCVar3;
  Rebuild(&local_88,tree,true);
  pCVar6 = pCVar3;
  if (local_88 != (CordRepBtree *)0x0) {
    lVar5 = 8;
    pCVar2 = local_88;
    do {
      pCVar4 = pCVar2;
      bVar7 = lVar5 == 0x68;
      pCVar6 = pCVar3;
      if (bVar7) break;
      plVar1 = (long *)((long)&local_88 + lVar5);
      lVar5 = lVar5 + 8;
      pCVar2 = (CordRepBtree *)*plVar1;
      pCVar6 = pCVar4;
    } while ((CordRepBtree *)*plVar1 != (CordRepBtree *)0x0);
  }
  if (!bVar7) {
    return pCVar6;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                ,0x48a,
                "static CordRepBtree *absl::cord_internal::CordRepBtree::Rebuild(CordRepBtree *)");
}

Assistant:

CordRepBtree* CordRepBtree::Rebuild(CordRepBtree* tree) {
  // Set up initial stack with empty leaf node.
  CordRepBtree* node = CordRepBtree::New();
  CordRepBtree* stack[CordRepBtree::kMaxDepth + 1] = {node};

  // Recursively build the tree, consuming the input tree.
  Rebuild(stack, tree, /* consume reference */ true);

  // Return top most node
  for (CordRepBtree* parent : stack) {
    if (parent == nullptr) return node;
    node = parent;
  }

  // Unreachable
  assert(false);
  return nullptr;
}